

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

void capnp::compiler::anon_unknown_0::checkExampleValue
               (Reader *value,uint ordinal,Reader type,uint sharedOrdinalCount)

{
  double dVar1;
  Reader type_00;
  Reader type_01;
  Field field_00;
  Field field_01;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ReaderFor<bool> RVar5;
  int8_t iVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  int iVar9;
  int32_t iVar10;
  undefined2 uVar11;
  uint sharedOrdinalCount_00;
  uint sharedOrdinalCount_01;
  uint *params;
  char *__s2;
  char *ptrCopy;
  bool bVar12;
  StringPtr name;
  StringPtr name_00;
  ReaderFor<Text> RVar13;
  ReaderFor<DynamicEnum> RVar14;
  Field field;
  Fault f;
  StructSchema structType;
  Fault f_1;
  ReaderFor<capnp::DynamicStruct> structValue;
  uint local_25c;
  Reader local_258;
  PointerReader local_208;
  byte *local_1e1;
  undefined8 uStack_1c9;
  StructSchema local_1c0;
  StructSchema local_1b8;
  SegmentReader *local_1a8;
  byte *local_198;
  undefined8 uStack_180;
  PointerReader local_170;
  StructReader local_150;
  StructReader local_120;
  Reader local_f0;
  Reader local_a8;
  ReaderFor<DynamicStruct> local_60;
  
  if (type._reader.dataSize < 0x10) {
    uVar11 = 0;
  }
  else {
    uVar11 = *type._reader.data;
  }
  local_25c = ordinal;
  switch(uVar11) {
  case 1:
    RVar5 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(value);
    if (RVar5 == (ReaderFor<bool>)((byte)local_25c._0_1_ & 1)) {
      local_208.segment._0_7_ = 0;
      local_208.segment._7_1_ = 0;
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 2:
    iVar6 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply(value);
    if ((local_25c & 0xff) - 0x80 != (int)iVar6) {
      local_208.segment._0_7_ = 0;
      local_208.segment._7_1_ = 0;
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              ((Fault *)&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x226,FAILED,(char *)0x0,"\"You added a new possible field type!\"",
               (char (*) [37])"You added a new possible field type!");
    kj::_::Debug::Fault::fatal((Fault *)&local_258);
  case 4:
    iVar10 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply(value);
    if (iVar10 != local_25c * 0xb8df) {
      local_208.segment._0_7_ = 0;
      local_208.segment._7_1_ = 0;
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 7:
    uVar7 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(value);
    if (local_25c * 0xd != (uint)uVar7) {
      local_208.segment._0_7_ = 0;
      local_208.segment._7_1_ = 0;
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 0xb:
    dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(value);
    if ((dVar1 != (double)local_25c * 313.25) || (NAN(dVar1) || NAN((double)local_25c * 313.25))) {
      local_208.segment._0_7_ = 0;
      local_208.segment._7_1_ = 0;
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 0xc:
    RVar13 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(value);
    params = RVar13.super_StringPtr.content.size_;
    kj::str<unsigned_int&>((String *)&local_258,(kj *)&local_25c,params);
    uVar4 = local_258.field_1.intValue;
    uVar3 = local_258._0_8_;
    if (params == (uint *)(local_258.field_1.textValue.super_StringPtr.content.ptr +
                          (local_258.field_1._0_8_ == (char *)0x0))) {
      __s2 = "";
      if (local_258.field_1._0_8_ != (char *)0x0) {
        __s2 = (char *)local_258._0_8_;
      }
      iVar9 = bcmp(RVar13.super_StringPtr.content.ptr,__s2,(long)params - 1);
      bVar12 = iVar9 == 0;
    }
    else {
      bVar12 = false;
    }
    if ((char *)local_258._0_8_ != (char *)0x0) {
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      (*(code *)**(undefined8 **)
                  CONCAT62(local_258.field_1.textValue.super_StringPtr.content.size_._2_6_,
                           local_258.field_1.enumValue.value))
                ((undefined8 *)
                 CONCAT62(local_258.field_1.textValue.super_StringPtr.content.size_._2_6_,
                          local_258.field_1.enumValue.value),uVar3,1,uVar4,uVar4,0);
    }
    if (!bVar12) {
      local_208.segment._0_7_ = 0;
      local_208.segment._7_1_ = 0;
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 0xe:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_258,value);
    DynamicList::Reader::operator[](&local_f0,(Reader *)&local_258,0);
    uVar2 = local_25c;
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      type._reader.pointers = (WirePointer *)0x0;
      type._reader.segment = (SegmentReader *)0x0;
      type._reader.capTable = (CapTableReader *)0x0;
    }
    local_208.segment._0_7_ = SUB87(type._reader.segment,0);
    local_208.segment._7_1_ = (undefined1)((ulong)type._reader.segment >> 0x38);
    local_208.capTable._0_2_ = (uint16_t)type._reader.capTable;
    local_208.capTable._2_5_ = (undefined5)((ulong)type._reader.capTable >> 0x10);
    local_208.capTable._7_1_ = (undefined1)((ulong)type._reader.capTable >> 0x38);
    local_208.pointer._0_7_ = SUB87(type._reader.pointers,0);
    local_208.pointer._7_1_ = (undefined1)((ulong)type._reader.pointers >> 0x38);
    local_208.nestingLimit = type._reader.nestingLimit;
    _::PointerReader::getStruct(&local_150,&local_208,(word *)0x0);
    type_00._reader.capTable = local_150.capTable;
    type_00._reader.segment = local_150.segment;
    type_00._reader.data = local_150.data;
    type_00._reader.pointers = local_150.pointers;
    type_00._reader.dataSize = local_150.dataSize;
    type_00._reader.pointerCount = local_150.pointerCount;
    type_00._reader._38_2_ = local_150._38_2_;
    type_00._reader.nestingLimit = local_150.nestingLimit;
    type_00._reader._44_4_ = local_150._44_4_;
    checkExampleValue(&local_f0,uVar2,type_00,sharedOrdinalCount_00);
    DynamicValue::Reader::~Reader(&local_f0);
    break;
  case 0xf:
    RVar14 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(value);
    local_208.segment._0_7_ = RVar14.schema.super_Schema.raw._0_7_;
    local_208.segment._7_1_ = RVar14.schema.super_Schema.raw._7_1_;
    local_208.capTable._0_2_ = RVar14.value;
    DynamicEnum::getEnumerant
              ((Maybe<capnp::EnumSchema::Enumerant> *)&local_258,(DynamicEnum *)&local_208);
    uVar2 = local_25c;
    if ((undefined1)local_258.type == UNKNOWN) {
      local_208.segment._0_7_ = 0;
      local_208.segment._7_1_ = 0;
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    local_208.segment._0_7_ = (undefined7)local_258.field_1.intValue;
    local_208.segment._7_1_ = (undefined1)((ulong)local_258.field_1._0_8_ >> 0x38);
    EnumSchema::getEnumerants((EnumerantList *)&local_258,(EnumSchema *)&local_208);
    if (uVar2 % (uint)local_258.field_1.anyPointerValue.reader.nestingLimit !=
        (uint)local_258.field_1.enumValue.value) {
      local_208.segment._0_7_ = 0;
      local_208.segment._7_1_ = 0;
      local_258.type = UNKNOWN;
      local_258._4_4_ = 0;
      local_258.field_1.intValue = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_208,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    }
    break;
  case 0x10:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_60,value);
    local_1c0.super_Schema.raw = local_60.schema.super_Schema.raw;
    name.content.size_ = 2;
    name.content.ptr = "i";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&local_258,&local_1c0,name);
    if ((undefined1)local_258.type == VOID) {
      field_00.proto._reader.capTable._4_4_ = local_258.field_1._28_4_;
      field_00.proto._reader.capTable._0_4_ = local_258.field_1.anyPointerValue.reader.nestingLimit;
      field_00.proto._reader.pointers._4_2_ = local_258.field_1.structValue.reader.pointerCount;
      field_00.proto._reader.pointers._0_4_ = local_258.field_1.listValue.reader.elementCount;
      field_00.proto._reader.pointers._6_2_ = local_258.field_1.listValue.reader.step._2_2_;
      field_00.proto._reader._36_4_ = local_258.field_1._52_4_;
      field_00.proto._reader.dataSize = local_258.field_1.listValue.reader.structDataSize;
      uStack_1c9 = local_258.field_1._56_8_;
      local_1e1 = local_258.field_1.listValue.reader.ptr;
      local_208.pointer._7_1_ = SUB81(local_258.field_1.listValue.reader.segment,0);
      local_208.nestingLimit = (int)((ulong)local_258.field_1._16_8_ >> 8);
      local_208._28_3_ = SUB83((ulong)local_258.field_1._16_8_ >> 0x28,0);
      local_208.segment._7_1_ = (undefined1)local_258.field_1.intValue;
      local_208.capTable._0_2_ = (uint16_t)((ulong)local_258.field_1._0_8_ >> 8);
      local_208.capTable._2_5_ = (undefined5)((ulong)local_258.field_1._0_8_ >> 0x18);
      local_208.capTable._7_1_ = (undefined1)local_258.field_1.enumValue.value;
      local_208.pointer._0_7_ =
           (undefined7)
           (CONCAT62(local_258.field_1.textValue.super_StringPtr.content.size_._2_6_,
                     local_258.field_1.enumValue.value) >> 8);
      local_1b8.super_Schema.raw = (Schema)(Schema)local_258.field_1.intValue;
      local_1a8 = local_258.field_1.listValue.reader.segment;
      local_198 = local_258.field_1.listValue.reader.ptr;
      uStack_180 = local_258.field_1._56_8_;
      field_00._8_8_ =
           CONCAT62(local_258.field_1.textValue.super_StringPtr.content.size_._2_6_,
                    local_258.field_1.enumValue.value);
      field_00.parent.super_Schema.raw = (Schema)(Schema)local_258.field_1.intValue;
      field_00.proto._reader.segment = local_258.field_1.listValue.reader.segment;
      field_00.proto._reader.data = local_258.field_1.listValue.reader.ptr;
      field_00.proto._reader._40_8_ = local_258.field_1._56_8_;
      DynamicStruct::Reader::get(&local_258,&local_60,field_00);
      uVar8 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_258);
      uVar2 = local_25c;
      DynamicValue::Reader::~Reader(&local_258);
      if (uVar8 != uVar2) {
        local_170.segment = (SegmentReader *)0x0;
        local_258.type = UNKNOWN;
        local_258._4_4_ = 0;
        local_258.field_1.intValue = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_170,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_170);
      }
    }
    else {
      name_00.content.size_ = 3;
      name_00.content.ptr = "f0";
      StructSchema::getFieldByName((Field *)&local_258,&local_1c0,name_00);
      field_01.proto._reader.segment._2_6_ =
           local_258.field_1.textValue.super_StringPtr.content.size_._2_6_;
      field_01.proto._reader.segment._0_2_ = local_258.field_1.enumValue.value;
      field_01.proto._reader.data._4_4_ = local_258.field_1._28_4_;
      field_01.proto._reader.data._0_4_ = local_258.field_1.anyPointerValue.reader.nestingLimit;
      field_01.proto._reader.pointerCount = local_258.field_1.structValue.reader.pointerCount;
      field_01.proto._reader.dataSize = local_258.field_1.listValue.reader.elementCount;
      field_01.proto._reader._38_2_ = local_258.field_1.listValue.reader.step._2_2_;
      field_01.proto._reader._44_4_ = local_258.field_1._52_4_;
      field_01.proto._reader.nestingLimit = local_258.field_1.listValue.reader.structDataSize;
      field_01._8_8_ = local_258.field_1.intValue;
      field_01.parent.super_Schema.raw = (Schema)(Schema)local_258._0_8_;
      field_01.proto._reader.capTable = (CapTableReader *)local_258.field_1.listValue.reader.segment
      ;
      field_01.proto._reader.pointers = (WirePointer *)local_258.field_1.listValue.reader.ptr;
      DynamicStruct::Reader::get(&local_a8,&local_60,field_01);
      uVar2 = local_25c;
      if (local_258.field_1.structValue.reader.pointerCount < 3) {
        local_258.field_1.listValue.reader.structDataSize = 0x7fffffff;
        local_258.field_1.listValue.reader.segment = (SegmentReader *)0x0;
        local_170.pointer = (WirePointer *)0x0;
        local_170.segment = (SegmentReader *)0x0;
      }
      else {
        local_170.segment =
             (SegmentReader *)
             CONCAT62(local_258.field_1.textValue.super_StringPtr.content.size_._2_6_,
                      local_258.field_1.enumValue.value);
        local_170.pointer = (WirePointer *)(local_258.field_1.listValue.reader.ptr + 0x10);
      }
      local_170.capTable = (CapTableReader *)local_258.field_1.listValue.reader.segment;
      local_170.nestingLimit = local_258.field_1.listValue.reader.structDataSize;
      _::PointerReader::getStruct(&local_120,&local_170,(word *)0x0);
      type_01._reader.capTable = local_120.capTable;
      type_01._reader.segment = local_120.segment;
      type_01._reader.data = local_120.data;
      type_01._reader.pointers = local_120.pointers;
      type_01._reader.dataSize = local_120.dataSize;
      type_01._reader.pointerCount = local_120.pointerCount;
      type_01._reader._38_2_ = local_120._38_2_;
      type_01._reader.nestingLimit = local_120.nestingLimit;
      type_01._reader._44_4_ = local_120._44_4_;
      checkExampleValue(&local_a8,uVar2,type_01,sharedOrdinalCount_01);
      DynamicValue::Reader::~Reader(&local_a8);
    }
  }
  return;
}

Assistant:

void checkExampleValue(DynamicValue::Reader value, uint ordinal, schema::Type::Reader type,
                       uint sharedOrdinalCount) {
  switch (type.which()) {
    case schema::Type::INT32: KJ_ASSERT(value.as<int32_t>() == ordinal * 47327); break;
    case schema::Type::FLOAT64: KJ_ASSERT(value.as<double>() == ordinal * 313.25); break;
    case schema::Type::INT8: KJ_ASSERT(value.as<int8_t>() == int(ordinal % 256) - 128); break;
    case schema::Type::UINT16: KJ_ASSERT(value.as<uint16_t>() == ordinal * 13); break;
    case schema::Type::BOOL: KJ_ASSERT(value.as<bool>() == (ordinal % 2 == 0)); break;
    case schema::Type::TEXT: KJ_ASSERT(value.as<Text>() == kj::str(ordinal)); break;
    case schema::Type::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto structType = structValue.getSchema();

      KJ_IF_MAYBE(fieldI, structType.findFieldByName("i")) {
        // Type is "StructType"
        KJ_ASSERT(structValue.get(*fieldI).as<uint32_t>() == ordinal);
      } else {
        // Type is "Int32Struct" or the like.
        auto field = structType.getFieldByName("f0");
        checkExampleValue(structValue.get(field), ordinal,
                          field.getProto().getSlot().getType(), sharedOrdinalCount);
      }
      break;
    }
    case schema::Type::ENUM: {
      auto enumerant = KJ_ASSERT_NONNULL(value.as<DynamicEnum>().getEnumerant());
      KJ_ASSERT(enumerant.getIndex() ==
          ordinal % enumerant.getContainingEnum().getEnumerants().size());
      break;
    }
    case schema::Type::LIST:
      checkExampleValue(value.as<DynamicList>()[0], ordinal, type.getList().getElementType(),
                        sharedOrdinalCount);
      break;
    default:
      KJ_FAIL_ASSERT("You added a new possible field type!");
  }